

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall hwnet::util::TimerRoutine::Stop(TimerRoutine *this)

{
  bool bVar1;
  TimerRoutine *this_local;
  
  std::mutex::lock(&(this->mgr).mtx);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->stoped);
  if (bVar1) {
    std::mutex::unlock(&(this->mgr).mtx);
  }
  else {
    std::atomic<bool>::operator=(&this->stoped,true);
    if ((this->waitting & 1U) != 0) {
      std::_V2::condition_variable_any::notify_one(&this->cv);
    }
    std::mutex::unlock(&(this->mgr).mtx);
    std::thread::join();
  }
  return;
}

Assistant:

void TimerRoutine::Stop() {
	this->mgr.mtx.lock();
	if(this->stoped){
		this->mgr.mtx.unlock();
		return;
	}
	this->stoped = true;
	if(this->waitting) {
		this->cv.notify_one();
	}
	this->mgr.mtx.unlock();
	this->thd.join();
}